

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O2

void __thiscall
duckdb::WriteAheadLogDeserializer::ReplayCreateIndex(WriteAheadLogDeserializer *this)

{
  BinaryDeserializer *deserializer;
  ClientContext *context;
  Catalog *this_00;
  int iVar1;
  CreateIndexInfo *info;
  pointer pCVar2;
  TableCatalogEntry *table;
  undefined4 extraout_var;
  TableIOManager *args_2;
  undefined1 local_e0 [8];
  templated_unique_single_t unbound_index;
  _Head_base<0UL,_duckdb::UnboundIndex_*,_false> local_d0;
  IndexStorageInfo index_info;
  
  deserializer = &this->deserializer;
  Deserializer::
  ReadProperty<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>
            ((Deserializer *)local_e0,(field_id_t)deserializer,(char *)0x65);
  Deserializer::ReadProperty<duckdb::IndexStorageInfo>
            (&index_info,&deserializer->super_Deserializer,0x66,"index_storage_info");
  ReplayIndexData(this->db,deserializer,&index_info,this->deserialize_only);
  if (this->deserialize_only == false) {
    info = (CreateIndexInfo *)
           unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)local_e0);
    if ((info->index_type)._M_string_length == 0) {
      ::std::__cxx11::string::assign((char *)&info->index_type);
    }
    context = this->context;
    this_00 = this->catalog;
    pCVar2 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
             operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                         *)local_e0);
    table = Catalog::GetEntry<duckdb::TableCatalogEntry>
                      (this_00,context,&pCVar2->schema,&info->table,
                       (QueryErrorContext)0xffffffffffffffff);
    iVar1 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
              _vptr_CatalogEntry[0x10])(table);
    args_2 = DataTable::GetTableIOManager((DataTable *)CONCAT44(extraout_var,iVar1));
    SchemaCatalogEntry::CreateIndex((table->super_StandardEntry).schema,this->context,info,table);
    make_uniq<duckdb::UnboundIndex,duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,duckdb::IndexStorageInfo,duckdb::TableIOManager&,duckdb::AttachedDatabase&>
              ((duckdb *)&unbound_index,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               local_e0,&index_info,args_2,this->db);
    local_d0._M_head_impl = (UnboundIndex *)unbound_index;
    unbound_index.super_unique_ptr<duckdb::UnboundIndex,_std::default_delete<duckdb::UnboundIndex>_>
    ._M_t.super___uniq_ptr_impl<duckdb::UnboundIndex,_std::default_delete<duckdb::UnboundIndex>_>.
    _M_t.super__Tuple_impl<0UL,_duckdb::UnboundIndex_*,_std::default_delete<duckdb::UnboundIndex>_>.
    super__Head_base<0UL,_duckdb::UnboundIndex_*,_false>._M_head_impl =
         (unique_ptr<duckdb::UnboundIndex,_std::default_delete<duckdb::UnboundIndex>_>)
         (__uniq_ptr_data<duckdb::UnboundIndex,_std::default_delete<duckdb::UnboundIndex>,_true,_true>
          )0x0;
    DataTable::AddIndex((DataTable *)CONCAT44(extraout_var,iVar1),
                        (unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *)
                        &local_d0);
    if (local_d0._M_head_impl != (UnboundIndex *)0x0) {
      (*((local_d0._M_head_impl)->super_Index)._vptr_Index[1])();
    }
    ::std::unique_ptr<duckdb::UnboundIndex,_std::default_delete<duckdb::UnboundIndex>_>::~unique_ptr
              (&unbound_index.
                super_unique_ptr<duckdb::UnboundIndex,_std::default_delete<duckdb::UnboundIndex>_>);
  }
  IndexStorageInfo::~IndexStorageInfo(&index_info);
  if (local_e0 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_e0 + 8))();
  }
  return;
}

Assistant:

void WriteAheadLogDeserializer::ReplayCreateIndex() {
	auto create_info = deserializer.ReadProperty<unique_ptr<CreateInfo>>(101, "index_catalog_entry");
	auto index_info = deserializer.ReadProperty<IndexStorageInfo>(102, "index_storage_info");

	ReplayIndexData(db, deserializer, index_info, DeserializeOnly());
	if (DeserializeOnly()) {
		return;
	}
	auto &info = create_info->Cast<CreateIndexInfo>();

	// Ensure that the index type exists.
	if (info.index_type.empty()) {
		info.index_type = ART::TYPE_NAME;
	}

	auto &table = catalog.GetEntry<TableCatalogEntry>(context, create_info->schema, info.table).Cast<DuckTableEntry>();
	auto &storage = table.GetStorage();
	auto &io_manager = TableIOManager::Get(storage);

	// Create the index in the catalog.
	table.schema.CreateIndex(context, info, table);

	// add the index to the storage
	auto unbound_index = make_uniq<UnboundIndex>(std::move(create_info), std::move(index_info), io_manager, db);
	storage.AddIndex(std::move(unbound_index));
}